

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationsettings.cpp
# Opt level: O0

uint32_t __thiscall icu_63::CollationSettings::reorderEx(CollationSettings *this,uint32_t p)

{
  uint *local_30;
  uint32_t *ranges;
  uint32_t r;
  uint32_t q;
  uint32_t p_local;
  CollationSettings *this_local;
  
  this_local._4_4_ = p;
  if (p < this->minHighNoReorder) {
    for (local_30 = this->reorderRanges; *local_30 <= (p | 0xffff); local_30 = local_30 + 1) {
    }
    this_local._4_4_ = p + *local_30 * 0x1000000;
  }
  return this_local._4_4_;
}

Assistant:

uint32_t
CollationSettings::reorderEx(uint32_t p) const {
    if(p >= minHighNoReorder) { return p; }
    // Round up p so that its lower 16 bits are >= any offset bits.
    // Then compare q directly with (limit, offset) pairs.
    uint32_t q = p | 0xffff;
    uint32_t r;
    const uint32_t *ranges = reorderRanges;
    while(q >= (r = *ranges)) { ++ranges; }
    return p + (r << 24);
}